

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDTree.h
# Opt level: O0

void __thiscall
KDTree<YaoMST::PointPair,_2,_YaoMST::NewAt>::anyGreater
          (KDTree<YaoMST::PointPair,_2,_YaoMST::NewAt> *this,PointPair *pt,PointPair *l,PointPair *r
          )

{
  bool bVar1;
  bool bVar2;
  size_type __n;
  PointPair *in_RCX;
  PointPair *in_RDX;
  KDTree<YaoMST::PointPair,_2,_YaoMST::NewAt> *in_RSI;
  long *in_RDI;
  double dVar3;
  double dVar4;
  int d;
  bool check;
  long midIndex;
  PointPair *mid;
  PointPair *in_stack_ffffffffffffff78;
  NewAt *in_stack_ffffffffffffff80;
  NewAt *this_00;
  int local_38;
  PointPair *r_00;
  
  if (in_RDX < in_RCX) {
    r_00 = in_RDX + ((long)in_RCX - (long)in_RDX) / 0x50;
    __n = ((long)r_00 - *in_RDI) / 0x28;
    bVar1 = true;
    local_38 = 0;
    while( true ) {
      bVar2 = false;
      if (local_38 < 2) {
        bVar2 = bVar1;
      }
      if (!bVar2) break;
      dVar3 = YaoMST::NewAt::operator()(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,0);
      dVar4 = YaoMST::NewAt::operator()(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,0);
      bVar1 = (bool)(bVar1 & dVar4 <= dVar3);
      local_38 = local_38 + 1;
    }
    if (bVar1) {
      *(undefined1 *)(in_RDI + 0xc) = 1;
    }
    else {
      anyGreater(in_RSI,in_RDX,in_RCX,r_00);
      if ((*(byte *)(in_RDI + 0xc) & 1) == 0) {
        this_00 = (NewAt *)(in_RDI + 5);
        std::vector<int,_std::allocator<int>_>::operator[]
                  ((vector<int,_std::allocator<int>_> *)(in_RDI + 2),__n);
        dVar3 = YaoMST::NewAt::operator()(this_00,in_stack_ffffffffffffff78,0);
        std::vector<int,_std::allocator<int>_>::operator[]
                  ((vector<int,_std::allocator<int>_> *)(in_RDI + 2),__n);
        dVar4 = YaoMST::NewAt::operator()(this_00,in_stack_ffffffffffffff78,0);
        if (dVar3 <= dVar4) {
          anyGreater(in_RSI,in_RDX,in_RCX,r_00);
        }
      }
    }
  }
  return;
}

Assistant:

void anyGreater(const Point &pt, Point *l, Point *r)
	{
		if (l >= r) return;
		auto mid = l + (r - l) / 2;
		auto midIndex = mid - first;
		bool check = true;
		for (int d = 0; d < K && check; ++d)
			check &= coordinate(*mid, d) >= coordinate(pt, d);
		if (check)
			return void(found = true);
		anyGreater(pt, mid + 1, r);
		if (!found && coordinate(pt, split[midIndex]) <= coordinate(*mid, split[midIndex]))
			anyGreater(pt, l, mid);
	}